

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O0

HighsStatus __thiscall Highs::passRowName(Highs *this,HighsInt row,string *name)

{
  int iVar1;
  undefined8 uVar2;
  reference this_00;
  string *in_RDX;
  uint in_ESI;
  HighsNameHash *in_RDI;
  HighsInt num_row;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd8;
  uint uVar3;
  HighsNameHash *this_01;
  HighsStatus local_4;
  
  uVar3 = *(uint *)((long)(in_RDI + 5) + 0x24);
  if (((int)in_ESI < 0) || ((int)uVar3 <= (int)in_ESI)) {
    uVar2 = std::__cxx11::string::c_str();
    highsLogUser((HighsLogOptions *)((long)(in_RDI + 0x40) + 0x28),kError,
                 "Index %d for row name %s is outside the range [0, num_row = %d)\n",(ulong)in_ESI,
                 uVar2,(ulong)uVar3);
    local_4 = kError;
  }
  else {
    this_01 = in_RDI;
    iVar1 = std::__cxx11::string::length();
    if (iVar1 < 1) {
      highsLogUser((HighsLogOptions *)((long)(in_RDI + 0x40) + 0x28),kError,
                   "Cannot define empty column names\n");
      local_4 = kError;
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::resize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_RDI,CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)((long)(in_RDI + 0xb) + 0x30),(long)(int)in_ESI);
      HighsNameHash::update
                (this_01,in_ESI,in_RDX,(string *)CONCAT44(uVar3,in_stack_ffffffffffffffd8));
      this_00 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)((long)(in_RDI + 0xb) + 0x30),(long)(int)in_ESI);
      std::__cxx11::string::operator=((string *)this_00,(string *)in_RDX);
      local_4 = kOk;
    }
  }
  return local_4;
}

Assistant:

HighsStatus Highs::passRowName(const HighsInt row, const std::string& name) {
  const HighsInt num_row = this->model_.lp_.num_row_;
  if (row < 0 || row >= num_row) {
    highsLogUser(
        options_.log_options, HighsLogType::kError,
        "Index %d for row name %s is outside the range [0, num_row = %d)\n",
        int(row), name.c_str(), int(num_row));
    return HighsStatus::kError;
  }
  if (int(name.length()) <= 0) {
    highsLogUser(options_.log_options, HighsLogType::kError,
                 "Cannot define empty column names\n");
    return HighsStatus::kError;
  }
  this->model_.lp_.row_names_.resize(num_row);
  this->model_.lp_.row_hash_.update(row, this->model_.lp_.row_names_[row],
                                    name);
  this->model_.lp_.row_names_[row] = name;
  return HighsStatus::kOk;
}